

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputLZWDecodeStream.cpp
# Opt level: O2

int __thiscall InputLZWDecodeStream::GetCode(InputLZWDecodeStream *this)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  Byte buffer;
  
  iVar4 = this->inputBits;
  while( true ) {
    iVar1 = this->nextBits;
    if (iVar1 <= iVar4) break;
    (*this->mSourceStream->_vptr_IByteReader[2])(this->mSourceStream,&buffer,1);
    this->inputBuf = this->inputBuf << 8 | (uint)buffer;
    iVar4 = this->inputBits + 8;
    this->inputBits = iVar4;
  }
  bVar3 = (byte)(iVar4 - iVar1);
  uVar2 = this->inputBuf;
  this->inputBits = iVar4 - iVar1;
  this->inputBuf = ~(-1 << (bVar3 & 0x1f)) & uVar2;
  return ~(-1 << ((byte)iVar1 & 0x1f)) & (int)uVar2 >> (bVar3 & 0x1f);
}

Assistant:

int InputLZWDecodeStream::GetCode() {
	int c;
	int code;

	IOBasicTypes::Byte buffer;
	while (inputBits < nextBits) 
	{
		mSourceStream->Read(&buffer, 1);
		c = buffer;

		if (c == -1) return -1;
		inputBuf = (inputBuf << 8) | (c & 0xff);
		inputBits += 8;
	}
	code = (inputBuf >> (inputBits - nextBits)) & ((1 << nextBits) - 1);
	inputBits -= nextBits;
	inputBuf = inputBuf & ((1 << inputBits) - 1); // avoid overflow by limiting to the bits its supposed to use 
	return code;
}